

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O1

RtAudioErrorType __thiscall RtApiAlsa::abortStream(RtApiAlsa *this)

{
  ostringstream *poVar1;
  StreamMutex *__mutex;
  StreamState SVar2;
  undefined8 *puVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  ostream *poVar7;
  char *pcVar8;
  RtAudioErrorType RVar9;
  RtAudioErrorType type;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  SVar2 = (this->super_RtApi).stream_.state;
  if (SVar2 < STREAM_STOPPING) {
    if (SVar2 == STREAM_CLOSED) {
LAB_0010e7a5:
      pcVar6 = (char *)(this->super_RtApi).errorText_._M_string_length;
      pcVar8 = "RtApiAlsa::abortStream(): the stream is stopping or closed!";
    }
    else {
      if (SVar2 != STREAM_STOPPED) goto LAB_0010e7c7;
      pcVar6 = (char *)(this->super_RtApi).errorText_._M_string_length;
      pcVar8 = "RtApiAlsa::abortStream(): the stream is already stopped!";
    }
    std::__cxx11::string::_M_replace((ulong)&(this->super_RtApi).errorText_,0,pcVar6,(ulong)pcVar8);
  }
  else {
    if (SVar2 == STREAM_STOPPING) goto LAB_0010e7a5;
    if (SVar2 == STREAM_RUNNING) {
      (this->super_RtApi).stream_.state = STREAM_STOPPED;
      __mutex = &(this->super_RtApi).stream_.mutex;
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      puVar3 = (undefined8 *)(this->super_RtApi).stream_.apiHandle;
      if ((((this->super_RtApi).stream_.mode & ~DUPLEX) == OUTPUT) &&
         (iVar4 = snd_pcm_drop(*puVar3), iVar4 < 0)) {
        poVar7 = (ostream *)&(this->super_RtApi).errorStream_;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"RtApiAlsa::abortStream: error aborting output pcm device, ",0x3a);
        pcVar6 = (char *)snd_strerror(iVar4);
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
        }
        else {
          sVar5 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,sVar5);
        }
      }
      else {
        if ((1 < (uint)((this->super_RtApi).stream_.mode + ~OUTPUT)) ||
           ((*(char *)(puVar3 + 2) != '\0' || (iVar4 = snd_pcm_drop(puVar3[1]), -1 < iVar4)))) {
          *(undefined1 *)(puVar3 + 9) = 0;
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          return RTAUDIO_NO_ERROR;
        }
        poVar1 = &(this->super_RtApi).errorStream_;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"RtApiAlsa::abortStream: error aborting input pcm device, ",
                   0x39);
        pcVar6 = (char *)snd_strerror(iVar4);
        poVar7 = std::operator<<((ostream *)poVar1,pcVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,".",1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&(this->super_RtApi).errorText_,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      *(undefined1 *)(puVar3 + 9) = 0;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      RVar9 = RTAUDIO_SYSTEM_ERROR;
      type = RTAUDIO_SYSTEM_ERROR;
      goto LAB_0010e7d4;
    }
  }
LAB_0010e7c7:
  RVar9 = RTAUDIO_WARNING;
  type = RTAUDIO_WARNING;
LAB_0010e7d4:
  RtApi::error(&this->super_RtApi,type);
  return RVar9;
}

Assistant:

RtAudioErrorType RtApiAlsa :: abortStream()
{
  if ( stream_.state != STREAM_RUNNING ) {
    if ( stream_.state == STREAM_STOPPED )
      errorText_ = "RtApiAlsa::abortStream(): the stream is already stopped!";
    else if ( stream_.state == STREAM_STOPPING || stream_.state == STREAM_CLOSED )
      errorText_ = "RtApiAlsa::abortStream(): the stream is stopping or closed!";
    return error( RTAUDIO_WARNING );
  }

  stream_.state = STREAM_STOPPED;
  MUTEX_LOCK( &stream_.mutex );

  int result = 0;
  AlsaHandle *apiInfo = (AlsaHandle *) stream_.apiHandle;
  snd_pcm_t **handle = (snd_pcm_t **) apiInfo->handles;
  if ( stream_.mode == OUTPUT || stream_.mode == DUPLEX ) {
    result = snd_pcm_drop( handle[0] );
    if ( result < 0 ) {
      errorStream_ << "RtApiAlsa::abortStream: error aborting output pcm device, " << snd_strerror( result ) << ".";
      errorText_ = errorStream_.str();
      goto unlock;
    }
  }

  if ( ( stream_.mode == INPUT || stream_.mode == DUPLEX ) && !apiInfo->synchronized ) {
    result = snd_pcm_drop( handle[1] );
    if ( result < 0 ) {
      errorStream_ << "RtApiAlsa::abortStream: error aborting input pcm device, " << snd_strerror( result ) << ".";
      errorText_ = errorStream_.str();
      goto unlock;
    }
  }

 unlock:
  apiInfo->runnable = false; // fixes high CPU usage when stopped
  MUTEX_UNLOCK( &stream_.mutex );

  if ( result < 0 ) return error( RTAUDIO_SYSTEM_ERROR );
  return RTAUDIO_NO_ERROR;
}